

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DynamicArrayType * __thiscall
slang::BumpAllocator::emplace<slang::ast::DynamicArrayType,slang::ast::Type_const&>
          (BumpAllocator *this,Type *args)

{
  DynamicArrayType *this_00;
  
  this_00 = (DynamicArrayType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DynamicArrayType *)this->endPtr < this_00 + 1) {
    this_00 = (DynamicArrayType *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::DynamicArrayType::DynamicArrayType(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }